

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflectance.cpp
# Opt level: O0

double phyr::frDielectric(double cosThetaI,double etaI,double etaT)

{
  double *pdVar1;
  double extraout_XMM0_Qa;
  double dVar2;
  double dVar3;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  double rPerp;
  double rParl;
  double cosThetaT;
  double sinThetaT;
  double sinThetaI;
  bool rayEntering;
  double in_stack_ffffffffffffff88;
  double in_stack_ffffffffffffff90;
  double local_60;
  double local_58 [2];
  double local_48;
  double local_40;
  double local_38;
  double local_30;
  undefined1 local_21;
  double local_20;
  double local_18;
  double local_10;
  double local_8;
  
  local_20 = in_XMM2_Qa;
  local_18 = in_XMM1_Qa;
  local_10 = clamp(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,8.63872299556482e-318);
  local_21 = 0.0 < local_10;
  if (!(bool)local_21) {
    pdVar1 = &local_18;
    std::swap<double>(pdVar1,&local_20);
    std::abs((int)pdVar1);
    local_10 = extraout_XMM0_Qa;
  }
  local_38 = 0.0;
  local_40 = -local_10 * local_10 + 1.0;
  pdVar1 = std::max<double>(&local_38,&local_40);
  local_30 = sqrt(*pdVar1);
  local_48 = (local_18 * local_30) / local_20;
  if (local_48 < 1.0) {
    local_58[0] = 0.0;
    local_60 = -local_48 * local_48 + 1.0;
    pdVar1 = std::max<double>(local_58,&local_60);
    dVar2 = sqrt(*pdVar1);
    dVar3 = (local_20 * local_10 + -(local_18 * dVar2)) / (local_20 * local_10 + local_18 * dVar2);
    dVar2 = (local_18 * local_10 + -(local_20 * dVar2)) / (local_18 * local_10 + local_20 * dVar2);
    local_8 = (dVar3 * dVar3 + dVar2 * dVar2) * 0.5;
  }
  else {
    local_8 = 1.0;
  }
  return local_8;
}

Assistant:

Real frDielectric(Real cosThetaI, Real etaI, Real etaT) {
    // Make sure cosThetaI is within expected range
    cosThetaI = clamp(cosThetaI, -1, 1);

    // Potentially swap indices of refraction.
    // If {cosThetaI} is between 0 and 1, the ray is entering
    // the medium and it's exiting the medium if the value is
    // between -1 and 0, which is when we need to swap the eta values.
    bool rayEntering = cosThetaI > 0;
    if (!rayEntering) {
        std::swap(etaI, etaT);
        cosThetaI = std::abs(cosThetaI);
    }

    // Compute {cosThetaT} using Snell's law
    Real sinThetaI = std::sqrt(std::max(Real(0), 1 - cosThetaI * cosThetaI));
    Real sinThetaT = etaI * sinThetaI / etaT;

    // No fresnel effect on total internal reflection
    if (sinThetaT >= 1) return 1;
    Real cosThetaT = std::sqrt(std::max(Real(0), 1 - sinThetaT * sinThetaT));

    // Apply the fresnel reflectance formulae for dielectrics
    Real rParl = ((etaT * cosThetaI) - (etaI * cosThetaT)) /
                 ((etaT * cosThetaI) + (etaI * cosThetaT));
    Real rPerp = ((etaI * cosThetaI) - (etaT * cosThetaT)) /
                 ((etaI * cosThetaI) + (etaT * cosThetaT));

    return (rParl * rParl + rPerp * rPerp) * 0.5;
}